

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.cpp
# Opt level: O0

void __thiscall
dg::llvmdg::SDGBuilder::buildBBlock(SDGBuilder *this,DependenceGraph *dg,BasicBlock *B)

{
  bool bVar1;
  reference this_00;
  ret_type n;
  DGNode *v;
  DGFormalParameters *this_01;
  undefined8 in_RDX;
  DependenceGraph *in_RSI;
  DepDGElement *in_RDI;
  DependenceGraph *unaff_retaddr;
  DGNode *ret;
  DGFormalParameters *params;
  CallInst *CI;
  DGNode *node;
  Instruction *I;
  iterator __end2;
  iterator __begin2;
  BasicBlock *__range2;
  DGBBlock *block;
  DGBBlock *in_stack_ffffffffffffffa0;
  BasicBlock *in_stack_ffffffffffffffa8;
  DependenceGraph *in_stack_ffffffffffffffb0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_38;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_30;
  undefined8 local_28;
  DGBBlock *local_20;
  undefined8 local_18;
  DependenceGraph *local_10;
  DepDGElement *CI_00;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  CI_00 = in_RDI;
  local_20 = sdg::DependenceGraph::createBBlock(in_stack_ffffffffffffffb0);
  SystemDependenceGraph::addBlkMapping
            ((SystemDependenceGraph *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  local_28 = local_18;
  local_30.NodePtr = (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_RDI);
  local_38.NodePtr = (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_RDI);
  while (bVar1 = llvm::operator!=(&local_30,&local_38), bVar1) {
    this_00 = llvm::
              ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
              ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                           *)0x136cee);
    n = llvm::dyn_cast<llvm::CallInst,llvm::Instruction>((Instruction *)in_stack_ffffffffffffffa0);
    if (n == (ret_type)0x0) {
      v = &sdg::DependenceGraph::createInstruction((DependenceGraph *)0x0)->super_DGNode;
      bVar1 = llvm::isa<llvm::ReturnInst,llvm::Instruction>((Instruction *)0x136d46);
      if (bVar1) {
        this_01 = sdg::DependenceGraph::getParameters(local_10);
        in_stack_ffffffffffffffa0 =
             (DGBBlock *)sdg::DGParameters::getReturn(&this_01->super_DGParameters);
        if (in_stack_ffffffffffffffa0 == (DGBBlock *)0x0) {
          in_stack_ffffffffffffffa0 = (DGBBlock *)::dg::sdg::DGParameters::createReturn();
        }
        sdg::DepDGElement::addUser(&in_stack_ffffffffffffffa0->super_DepDGElement,in_RDI);
      }
    }
    else {
      v = buildCallNode((SDGBuilder *)ret,unaff_retaddr,(CallInst *)CI_00);
    }
    sdg::DGBBlock::append(in_stack_ffffffffffffffa0,(DGNode *)in_RDI);
    SystemDependenceGraph::addMapping((SystemDependenceGraph *)this_00,(Value *)v,(DGElement *)n);
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                  *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void buildBBlock(sdg::DependenceGraph &dg, llvm::BasicBlock &B) {
        auto &block = dg.createBBlock();
        _llvmsdg->addBlkMapping(&B, &block);

        for (auto &I : B) {
            sdg::DGNode *node = nullptr;
            if (auto *CI = llvm::dyn_cast<llvm::CallInst>(&I)) {
                node = &buildCallNode(dg, CI);
            } else {
                node = &dg.createInstruction();
                if (llvm::isa<llvm::ReturnInst>(I)) {
                    // add formal 'ret' parameter
                    auto &params = dg.getParameters();
                    auto *ret = params.getReturn();
                    if (!ret)
                        ret = &params.createReturn();
                    // XXX: do we want the 'use' edge here?
                    node->addUser(*ret);
                }
            }
            assert(node && "Failed creating a node");

            block.append(node);
            _llvmsdg->addMapping(&I, node);
        }
    }